

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

void LogAllAvailableFormats(snd_pcm_t *pcm)

{
  long lVar1;
  size_t __n;
  undefined1 *__s;
  undefined8 uStack_20;
  
  uStack_20 = 0x10cac9;
  __n = snd_pcm_hw_params_sizeof();
  lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = &stack0xffffffffffffffe8 + lVar1;
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cae7;
  memset(__s,0,__n);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10caf2;
  snd_pcm_hw_params_any(pcm,__s);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10caff;
  snd_pcm_hw_params_test_format(pcm,__s,0);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cb0f;
  snd_pcm_hw_params_test_format(pcm,__s,1);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cb1f;
  snd_pcm_hw_params_test_format(pcm,__s,2);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cb2f;
  snd_pcm_hw_params_test_format(pcm,__s,3);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cb3f;
  snd_pcm_hw_params_test_format(pcm,__s,4);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cb4f;
  snd_pcm_hw_params_test_format(pcm,__s,5);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cb5f;
  snd_pcm_hw_params_test_format(pcm,__s,6);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cb6f;
  snd_pcm_hw_params_test_format(pcm,__s,7);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cb7f;
  snd_pcm_hw_params_test_format(pcm,__s,8);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cb8f;
  snd_pcm_hw_params_test_format(pcm,__s,9);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cb9f;
  snd_pcm_hw_params_test_format(pcm,__s,0xe);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cbaf;
  snd_pcm_hw_params_test_format(pcm,__s,0xf);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cbbf;
  snd_pcm_hw_params_test_format(pcm,__s,0x10);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cbcf;
  snd_pcm_hw_params_test_format(pcm,__s,0x11);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cbdf;
  snd_pcm_hw_params_test_format(pcm,__s,0x12);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cbef;
  snd_pcm_hw_params_test_format(pcm,__s,0x13);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cbff;
  snd_pcm_hw_params_test_format(pcm,__s,0x14);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cc0f;
  snd_pcm_hw_params_test_format(pcm,__s,0x15);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cc1f;
  snd_pcm_hw_params_test_format(pcm,__s,0x16);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cc2f;
  snd_pcm_hw_params_test_format(pcm,__s,0x17);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cc3f;
  snd_pcm_hw_params_test_format(pcm,__s,0x18);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cc4f;
  snd_pcm_hw_params_test_format(pcm,__s,0x1f);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cc5f;
  snd_pcm_hw_params_test_format(pcm,__s,0x20);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cc6f;
  snd_pcm_hw_params_test_format(pcm,__s,0x21);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cc7f;
  snd_pcm_hw_params_test_format(pcm,__s,0x22);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cc8f;
  snd_pcm_hw_params_test_format(pcm,__s,0x23);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cc9f;
  snd_pcm_hw_params_test_format(pcm,__s,0x24);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10ccaf;
  snd_pcm_hw_params_test_format(pcm,__s,0x25);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10ccbf;
  snd_pcm_hw_params_test_format(pcm,__s,0x26);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cccf;
  snd_pcm_hw_params_test_format(pcm,__s,0x27);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10ccdf;
  snd_pcm_hw_params_test_format(pcm,__s,0x28);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10ccef;
  snd_pcm_hw_params_test_format(pcm,__s,0x29);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10ccff;
  snd_pcm_hw_params_test_format(pcm,__s,0x2a);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cd0f;
  snd_pcm_hw_params_test_format(pcm,__s,0x2b);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cd1f;
  snd_pcm_hw_params_test_format(pcm,__s,2);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cd2f;
  snd_pcm_hw_params_test_format(pcm,__s,4);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cd3f;
  snd_pcm_hw_params_test_format(pcm,__s,6);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cd4f;
  snd_pcm_hw_params_test_format(pcm,__s,8);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cd5f;
  snd_pcm_hw_params_test_format(pcm,__s,10);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cd6f;
  snd_pcm_hw_params_test_format(pcm,__s,0xc);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cd7f;
  snd_pcm_hw_params_test_format(pcm,__s,0xe);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cd8f;
  snd_pcm_hw_params_test_format(pcm,__s,0x10);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x10cd9f;
  snd_pcm_hw_params_test_format(pcm,__s,0x12);
  return;
}

Assistant:

static void LogAllAvailableFormats( snd_pcm_t *pcm )
{
    PaSampleFormat available = 0;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    PA_DEBUG(( " --- Supported Formats ---\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S8\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U8\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MU_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MU_LAW\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_A_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_A_LAW\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IMA_ADPCM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IMA_ADPCM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MPEG ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MPEG\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_GSM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_GSM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_SPECIAL ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_SPECIAL\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S32\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U32\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME\n" ));

    PA_DEBUG(( " -------------------------\n" ));
}